

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

void rec_varg(jit_State *J,BCReg dst,ptrdiff_t nresults)

{
  byte bVar1;
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar2;
  long lVar3;
  TRef *pTVar4;
  IRRef1 IVar5;
  TRef TVar6;
  uint slot;
  TRef TVar7;
  TRef TVar8;
  IRRef1 IVar9;
  IROpT IVar10;
  ulong uVar11;
  long lVar12;
  int k;
  int32_t iVar13;
  GCobj *o;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  TRef local_4c;
  
  uVar14 = (ulong)dst;
  bVar1 = J->pt->numparams;
  lVar17 = J->L->base[-1].it64 >> 3;
  uVar11 = ~(ulong)bVar1;
  if (J->maxslot < dst) {
    J->base[dst - 1] = 0;
  }
  lVar18 = lVar17 + uVar11 + -1;
  if (J->framedepth < 1) {
    lVar12 = uVar11 + lVar17;
    (J->fold).ins.field_0.ot = 0x4713;
    (J->fold).ins.field_1.op12 = 0x120001;
    TVar6 = lj_opt_fold(J);
    uVar16 = (uint)bVar1;
    k = uVar16 * 8 + 0x13;
    IVar9 = (IRRef1)TVar6;
    if (nresults < 0) {
      if ((J->pc[1] & 0xffff00ff) == 0x2010041) {
        slot = J->pc[1] >> 8 & 0xff;
        aVar2 = J->L->base[slot].field_4;
        if ((aVar2.it >> 0xf == 0x1fff7) &&
           (o = (GCobj *)((ulong)aVar2 & 0x7fffffffffff), (o->gch).unused1 == '\x10')) {
          TVar7 = lj_ir_kgc(J,o,IRT_FUNC);
          TVar6 = J->base[slot];
          if (TVar6 == 0) {
            TVar6 = sload(J,slot);
          }
          (J->fold).ins.field_0.ot = 0x888;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
          lj_opt_fold(J);
          local_4c = J->base[dst - 1];
          iVar13 = lj_ffrecord_select_mode(J,local_4c,J->L->base + (dst - 1));
          if (-1 < iVar13) {
            if ((iVar13 != 0) && (4 < (local_4c >> 0x18 & 0x1f) - 0xf)) {
              (J->fold).ins.field_0.op1 = (IRRef1)local_4c;
              *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b93226e;
              local_4c = lj_opt_fold(J);
            }
            lVar17 = (long)iVar13;
            if ((short)(IRRef1)local_4c < 0 || iVar13 == 0) {
              if (lVar17 < lVar12) {
                TVar6 = lj_ir_kint(J,uVar16 * -8 + -0x13);
                (J->fold).ins.field_0.ot = 0x2913;
                (J->fold).ins.field_0.op1 = IVar9;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
                TVar6 = lj_opt_fold(J);
                if (bVar1 != 0) {
                  TVar7 = lj_ir_kint(J,0);
                  (J->fold).ins.field_0.ot = 0x193;
                  (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
                  (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
                  lj_opt_fold(J);
                }
                TVar7 = lj_ir_kint(J,3);
                (J->fold).ins.field_0.ot = 0x2513;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
                TVar6 = lj_opt_fold(J);
                if (iVar13 != 0) {
                  TVar7 = lj_ir_kint(J,-1);
                  (J->fold).ins.field_0.ot = 0x2913;
                  (J->fold).ins.field_0.op1 = (IRRef1)local_4c;
                  (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
                  local_4c = lj_opt_fold(J);
                  rec_idx_abc(J,TVar6,local_4c,(uint32_t)lVar18);
                }
              }
              else {
                TVar6 = lj_ir_kint(J,k);
                IVar5 = (IRRef1)TVar6;
                if (iVar13 == 0) {
                  TVar6 = lj_ir_kint(J,0);
                }
                else {
                  TVar6 = lj_ir_kint(J,3);
                  (J->fold).ins.field_0.ot = 0x2413;
                  (J->fold).ins.field_0.op1 = (IRRef1)local_4c;
                  (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
                  TVar6 = lj_opt_fold(J);
                  (J->fold).ins.field_0.ot = 0x2913;
                  (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
                  (J->fold).ins.field_0.op2 = IVar5;
                  TVar6 = lj_opt_fold(J);
                  IVar5 = (IRRef1)TVar6;
                  TVar6 = 0x7fff;
                }
                (J->fold).ins.field_0.ot = 0x93;
                (J->fold).ins.field_0.op1 = IVar9;
                (J->fold).ins.field_0.op2 = IVar5;
                lj_opt_fold(J);
              }
            }
            else {
              TVar6 = lj_ir_kint(J,k + iVar13 * 8);
              (J->fold).ins.field_0.ot = (ushort)(lVar17 < lVar12) << 8 | 0x93;
              (J->fold).ins.field_0.op1 = IVar9;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
              lj_opt_fold(J);
              k = uVar16 * 8 + 0xb;
              TVar6 = 0x7fff;
            }
            if ((iVar13 != 0) && (lVar17 < lVar12)) {
              (J->fold).ins.field_0.ot = 0x2a15;
              (J->fold).ins.field_0.op1 = 0x8000;
              (J->fold).ins.field_0.op2 = IVar9;
              TVar6 = lj_opt_fold(J);
              TVar7 = lj_ir_kint(J,k + -0x10);
              (J->fold).ins.field_0.ot = 0x2909;
              (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
              TVar6 = lj_opt_fold(J);
              lVar17 = J->L->base[(lVar17 - lVar12) + -2].it64;
              uVar16 = 0xe;
              if (0xfffffffffffffff1 < (ulong)(lVar17 >> 0x2f)) {
                uVar16 = ~(uint)(lVar17 >> 0x2f);
              }
              (J->fold).ins.field_0.ot = 0x3809;
              (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
              (J->fold).ins.field_0.op2 = (IRRef1)local_4c;
              TVar6 = lj_opt_fold(J);
              (J->fold).ins.field_0.ot = (ushort)uVar16 | 0x4880;
              (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
              (J->fold).ins.field_0.op2 = 0;
              TVar7 = lj_opt_fold(J);
              TVar6 = uVar16 * 0xffffff + 0x7fff;
              if (2 < uVar16) {
                TVar6 = TVar7;
              }
            }
            J->base[dst - 3] = TVar6;
            J->maxslot = dst - 2;
            J->bcskip = '\x02';
            if (-1 < iVar13) goto LAB_001322dd;
          }
        }
      }
      (J->errinfo).u64 = 0x4051c00000000000;
      lj_trace_err_info(J,LJ_TRERR_NYIBC);
    }
    if (lVar12 < 2) {
      TVar6 = lj_ir_kint(J,k);
      (J->fold).ins.field_0.ot = 0x293;
      (J->fold).ins.field_0.op1 = IVar9;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
      lj_opt_fold(J);
      lVar18 = 0;
    }
    else {
      if (nresults < lVar12) {
        iVar13 = k + (int)nresults * 8;
        IVar10 = 0x193;
        lVar12 = nresults;
      }
      else {
        iVar13 = J->L->base[-1].field_4.i;
        IVar10 = 0x893;
        lVar12 = lVar18;
      }
      TVar6 = lj_ir_kint(J,iVar13);
      (J->fold).ins.field_0.ot = IVar10;
      (J->fold).ins.field_0.op1 = IVar9;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
      lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x2a15;
      (J->fold).ins.field_0.op1 = 0x8000;
      (J->fold).ins.field_0.op2 = IVar9;
      TVar6 = lj_opt_fold(J);
      TVar7 = lj_ir_kint(J,uVar16 * 8 + 0xb);
      (J->fold).ins.field_0.ot = 0x2909;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
      TVar6 = lj_opt_fold(J);
      if (0 < lVar12) {
        lVar15 = 0;
        do {
          lVar3 = J->L->base[((ulong)bVar1 + lVar15) - lVar17].it64;
          uVar16 = ~(uint)(lVar3 >> 0x2f);
          if ((ulong)(lVar3 >> 0x2f) < 0xfffffffffffffff2) {
            uVar16 = 0xe;
          }
          (J->fold).ins.field_0.ot = (ushort)uVar16 | 0x4880;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
          (J->fold).ins.field_0.op2 = (IRRef1)lVar15;
          TVar8 = lj_opt_fold(J);
          TVar7 = uVar16 * 0xffffff + 0x7fff;
          if (2 < uVar16) {
            TVar7 = TVar8;
          }
          J->base[uVar14 + lVar15] = TVar7;
          lVar15 = lVar15 + 1;
        } while (lVar12 != lVar15);
      }
    }
    if (lVar18 < nresults) {
      pTVar4 = J->base;
      do {
        pTVar4[uVar14 + lVar18] = 0x7fff;
        lVar18 = lVar18 + 1;
      } while (nresults != lVar18);
    }
    uVar16 = (int)nresults + dst;
    if (J->maxslot < uVar16) {
      J->maxslot = uVar16;
    }
  }
  else {
    lVar17 = 0;
    if (0 < lVar18) {
      lVar17 = lVar18;
    }
    lVar12 = lVar17;
    if ((nresults == -1) || (lVar12 = nresults, (long)(ulong)J->maxslot < (long)(uVar14 + nresults))
       ) {
      J->maxslot = (int)lVar12 + dst;
    }
    if (0 < lVar12) {
      lVar15 = 0;
      do {
        TVar6 = 0x7fff;
        if ((lVar15 < lVar18) && (TVar6 = J->base[(lVar15 + -2) - lVar17], TVar6 == 0)) {
          TVar6 = sload(J,(-2 - (int)lVar17) + (int)lVar15);
        }
        J->base[(ulong)dst + lVar15] = TVar6;
        lVar15 = lVar15 + 1;
      } while (lVar12 != lVar15);
    }
  }
LAB_001322dd:
  if (J->maxslot + J->baseslot < 0xfa) {
    return;
  }
  lj_trace_err(J,LJ_TRERR_STACKOV);
}

Assistant:

static void rec_varg(jit_State *J, BCReg dst, ptrdiff_t nresults)
{
  int32_t numparams = J->pt->numparams;
  ptrdiff_t nvararg = frame_delta(J->L->base-1) - numparams - 1 - LJ_FR2;
  lj_assertJ(frame_isvarg(J->L->base-1), "VARG in non-vararg frame");
  if (LJ_FR2 && dst > J->maxslot)
    J->base[dst-1] = 0;  /* Prevent resurrection of unrelated slot. */
  if (J->framedepth > 0) {  /* Simple case: varargs defined on-trace. */
    ptrdiff_t i;
    if (nvararg < 0) nvararg = 0;
    if (nresults == -1) {
      nresults = nvararg;
      J->maxslot = dst + (BCReg)nvararg;
    } else if (dst + nresults > J->maxslot) {
      J->maxslot = dst + (BCReg)nresults;
    }
    for (i = 0; i < nresults; i++)
      J->base[dst+i] = i < nvararg ? getslot(J, i - nvararg - 1 - LJ_FR2) : TREF_NIL;
  } else {  /* Unknown number of varargs passed to trace. */
    TRef fr = emitir(IRTI(IR_SLOAD), LJ_FR2, IRSLOAD_READONLY|IRSLOAD_FRAME);
    int32_t frofs = 8*(1+LJ_FR2+numparams)+FRAME_VARG;
    if (nresults >= 0) {  /* Known fixed number of results. */
      ptrdiff_t i;
      if (nvararg > 0) {
	ptrdiff_t nload = nvararg >= nresults ? nresults : nvararg;
	TRef vbase;
	if (nvararg >= nresults)
	  emitir(IRTGI(IR_GE), fr, lj_ir_kint(J, frofs+8*(int32_t)nresults));
	else
	  emitir(IRTGI(IR_EQ), fr,
		 lj_ir_kint(J, (int32_t)frame_ftsz(J->L->base-1)));
	vbase = emitir(IRT(IR_SUB, IRT_IGC), REF_BASE, fr);
	vbase = emitir(IRT(IR_ADD, IRT_PGC), vbase, lj_ir_kint(J, frofs-8));
	for (i = 0; i < nload; i++) {
	  IRType t = itype2irt(&J->L->base[i-1-LJ_FR2-nvararg]);
	  J->base[dst+i] = lj_record_vload(J, vbase, i, t);
	}
      } else {
	emitir(IRTGI(IR_LE), fr, lj_ir_kint(J, frofs));
	nvararg = 0;
      }
      for (i = nvararg; i < nresults; i++)
	J->base[dst+i] = TREF_NIL;
      if (dst + (BCReg)nresults > J->maxslot)
	J->maxslot = dst + (BCReg)nresults;
    } else if (select_detect(J)) {  /* y = select(x, ...) */
      TRef tridx = J->base[dst-1];
      TRef tr = TREF_NIL;
      ptrdiff_t idx = lj_ffrecord_select_mode(J, tridx, &J->L->base[dst-1]);
      if (idx < 0) goto nyivarg;
      if (idx != 0 && !tref_isinteger(tridx))
	tridx = emitir(IRTGI(IR_CONV), tridx, IRCONV_INT_NUM|IRCONV_INDEX);
      if (idx != 0 && tref_isk(tridx)) {
	emitir(IRTGI(idx <= nvararg ? IR_GE : IR_LT),
	       fr, lj_ir_kint(J, frofs+8*(int32_t)idx));
	frofs -= 8;  /* Bias for 1-based index. */
      } else if (idx <= nvararg) {  /* Compute size. */
	TRef tmp = emitir(IRTI(IR_ADD), fr, lj_ir_kint(J, -frofs));
	if (numparams)
	  emitir(IRTGI(IR_GE), tmp, lj_ir_kint(J, 0));
	tr = emitir(IRTI(IR_BSHR), tmp, lj_ir_kint(J, 3));
	if (idx != 0) {
	  tridx = emitir(IRTI(IR_ADD), tridx, lj_ir_kint(J, -1));
	  rec_idx_abc(J, tr, tridx, (uint32_t)nvararg);
	}
      } else {
	TRef tmp = lj_ir_kint(J, frofs);
	if (idx != 0) {
	  TRef tmp2 = emitir(IRTI(IR_BSHL), tridx, lj_ir_kint(J, 3));
	  tmp = emitir(IRTI(IR_ADD), tmp2, tmp);
	} else {
	  tr = lj_ir_kint(J, 0);
	}
	emitir(IRTGI(IR_LT), fr, tmp);
      }
      if (idx != 0 && idx <= nvararg) {
	IRType t;
	TRef aref, vbase = emitir(IRT(IR_SUB, IRT_IGC), REF_BASE, fr);
	vbase = emitir(IRT(IR_ADD, IRT_PGC), vbase,
		       lj_ir_kint(J, frofs-(8<<LJ_FR2)));
	t = itype2irt(&J->L->base[idx-2-LJ_FR2-nvararg]);
	aref = emitir(IRT(IR_AREF, IRT_PGC), vbase, tridx);
	tr = lj_record_vload(J, aref, 0, t);
      }
      J->base[dst-2-LJ_FR2] = tr;
      J->maxslot = dst-1-LJ_FR2;
      J->bcskip = 2;  /* Skip CALLM + select. */
    } else {
    nyivarg:
      setintV(&J->errinfo, BC_VARG);
      lj_trace_err_info(J, LJ_TRERR_NYIBC);
    }
  }
  if (J->baseslot + J->maxslot >= LJ_MAX_JSLOTS)
    lj_trace_err(J, LJ_TRERR_STACKOV);
}